

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::setRowHidden(QTreeView *this,int row,QModelIndex *parent,bool hide)

{
  QAbstractItemViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  long in_FS_OFFSET;
  Bucket BVar2;
  QModelIndex local_68;
  QHashDummyValue local_49;
  QModelIndex local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = this_00->model;
  if (pQVar1 == (QAbstractItemModel *)0x0) goto LAB_0059c78f;
  local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.r = -0x55555556;
  local_68.c = -0x55555556;
  local_68.i._0_4_ = 0xaaaaaaaa;
  local_68.i._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_68,pQVar1,row,0,parent);
  if (((local_68.r < 0) || (local_68.c < 0)) || (local_68.m.ptr == (QAbstractItemModel *)0x0))
  goto LAB_0059c78f;
  if (hide) {
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_48,&local_68);
    QHash<QPersistentModelIndex,_QHashDummyValue>::emplace<QHashDummyValue>
              ((QHash<QPersistentModelIndex,_QHashDummyValue> *)
               &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate
                .redirectDev,(QPersistentModelIndex *)&local_48,&local_49);
LAB_0059c713:
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_48);
  }
  else {
    local_48.m.ptr = local_68.m.ptr;
    local_48.c = local_68.c;
    local_48.r = local_68.r;
    local_48.i = CONCAT44(local_68.i._4_4_,(undefined4)local_68.i);
    this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                **)(*(long *)(this_00->model + 8) + 0x90);
    if (this_01 !=
        (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
         *)0x0) {
      BVar2 = QHashPrivate::
              Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
              ::findBucket<QtPrivate::QModelIndexWrapper>(this_01,(QModelIndexWrapper *)&local_48);
      if ((BVar2.span[BVar2.index] != (Span)0xff) && (*(long *)(BVar2.span + 0x80) != 0)) {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_48,&local_68);
        QHash<QPersistentModelIndex,_QHashDummyValue>::removeImpl<QPersistentModelIndex>
                  ((QHash<QPersistentModelIndex,_QHashDummyValue> *)
                   &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                    super_QWidgetPrivate.redirectDev,(QPersistentModelIndex *)&local_48);
        goto LAB_0059c713;
      }
    }
  }
  QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,0);
LAB_0059c78f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::setRowHidden(int row, const QModelIndex &parent, bool hide)
{
    Q_D(QTreeView);
    if (!d->model)
        return;
    QModelIndex index = d->model->index(row, 0, parent);
    if (!index.isValid())
        return;

    if (hide) {
        d->hiddenIndexes.insert(index);
    } else if (d->isPersistent(index)) { //if the index is not persistent, it cannot be in the set
        d->hiddenIndexes.remove(index);
    }

    d->doDelayedItemsLayout();
}